

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O2

ON_Arc * __thiscall
ON_RevSurface::IsoArc(ON_Arc *__return_storage_ptr__,ON_RevSurface *this,double curve_parameter)

{
  ON_Line *this_00;
  ON_3dVector *this_01;
  ON_3dVector *v;
  ON_Curve *pOVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  ON_Arc *arc;
  ON_Plane *pOVar5;
  ON_Circle *pOVar6;
  ON_Arc *pOVar7;
  byte bVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  ON_3dPoint Q;
  ON_3dPoint P;
  ON_3dVector local_d0;
  ON_Circle circle;
  
  bVar8 = 0;
  pOVar1 = this->m_curve;
  if (pOVar1 != (ON_Curve *)0x0) {
    pOVar5 = &ON_Plane::World_xy;
    pOVar6 = &circle;
    for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pOVar6->plane).origin.x = (pOVar5->origin).x;
      pOVar5 = (ON_Plane *)&(pOVar5->origin).y;
      pOVar6 = (ON_Circle *)&(pOVar6->plane).origin.y;
    }
    circle.radius = 1.0;
    ON_Curve::PointAt(&P,pOVar1,curve_parameter);
    bVar3 = ON_3dPoint::IsValid(&P);
    if (bVar3) {
      this_00 = &this->m_axis;
      ON_Line::ClosestPointTo(&Q,this_00,&P);
      circle.plane.origin.z = Q.z;
      circle.plane.origin.x = Q.x;
      circle.plane.origin.y = Q.y;
      ON_Line::Tangent((ON_3dVector *)&Q,this_00);
      circle.plane.zaxis.z = Q.z;
      circle.plane.zaxis.x = Q.x;
      circle.plane.zaxis.y = Q.y;
      ON_3dPoint::operator-((ON_3dVector *)&Q,&P,(ON_3dPoint *)&circle);
      this_01 = &circle.plane.xaxis;
      circle.plane.xaxis.z = Q.z;
      circle.plane.xaxis.x = Q.x;
      circle.plane.xaxis.y = Q.y;
      circle.radius = ON_3dVector::Length(this_01);
      bVar3 = ON_3dVector::Unitize(this_01);
      v = &circle.plane.zaxis;
      if (!bVar3) {
        pOVar1 = this->m_curve;
        (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar1);
        local_d0.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        local_d0.y = in_XMM1_Qa;
        dVar2 = ON_Interval::ParameterAt((ON_Interval *)&local_d0,0.5);
        ON_Curve::PointAt(&Q,pOVar1,dVar2);
        P.z = Q.z;
        P.x = Q.x;
        P.y = Q.y;
        ON_Line::ClosestPointTo(&Q,this_00,&P);
        ON_3dPoint::operator-(&local_d0,&P,&Q);
        circle.plane.xaxis.z = local_d0.z;
        circle.plane.xaxis.x = local_d0.x;
        circle.plane.xaxis.y = local_d0.y;
        bVar3 = ON_3dVector::Unitize(this_01);
        if (!bVar3) {
          ON_3dVector::PerpendicularTo(this_01,v);
        }
      }
      ON_CrossProduct((ON_3dVector *)&Q,v,this_01);
      circle.plane.yaxis.z = Q.z;
      circle.plane.yaxis.x = Q.x;
      circle.plane.yaxis.y = Q.y;
      ON_3dVector::Unitize(&circle.plane.yaxis);
      ON_Plane::UpdateEquation(&circle.plane);
      ON_Arc::ON_Arc(__return_storage_ptr__,&circle,(ON_Interval)*&(this->m_angle).m_t);
      ON_Plane::~ON_Plane(&circle.plane);
      return __return_storage_ptr__;
    }
    ON_Plane::~ON_Plane(&circle.plane);
  }
  dVar2 = ON_Interval::ZeroToTwoPi.m_t[1];
  (__return_storage_ptr__->m_angle).m_t[0] = ON_Interval::ZeroToTwoPi.m_t[0];
  (__return_storage_ptr__->m_angle).m_t[1] = dVar2;
  pOVar5 = &ON_Plane::NanPlane;
  pOVar7 = __return_storage_ptr__;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pOVar7->super_ON_Circle).plane.origin.x = (pOVar5->origin).x;
    pOVar5 = (ON_Plane *)((long)pOVar5 + ((ulong)bVar8 * -2 + 1) * 8);
    pOVar7 = (ON_Arc *)((long)pOVar7 + (ulong)bVar8 * -0x10 + 8);
  }
  (__return_storage_ptr__->super_ON_Circle).radius = ON_DBL_QNAN;
  return __return_storage_ptr__;
}

Assistant:

ON_Arc ON_RevSurface::IsoArc(
  double curve_parameter
) const
{
  for (;;)
  {
    if (nullptr == m_curve)
      break;
    // 8 December 2003 Chuck - fix iso extraction bug
    //   when m_angle[0] != 0.
    ON_Circle circle;
    ON_3dPoint P = m_curve->PointAt(curve_parameter);
    if (false == P.IsValid())
      break;
    circle.plane.origin = m_axis.ClosestPointTo(P);
    circle.plane.zaxis = m_axis.Tangent();
    circle.plane.xaxis = P - circle.plane.origin;
    circle.radius = circle.plane.xaxis.Length();
    if (!circle.plane.xaxis.Unitize())
    {
      // 8 December 2003 Dale Lear - get valid zero radius
      //   arc/circle when revolute hits the axis.
      // First: try middle of revolute for x-axis
      P = m_curve->PointAt(m_curve->Domain().ParameterAt(0.5));
      ON_3dPoint Q = m_axis.ClosestPointTo(P);
      circle.plane.xaxis = P - Q;
      if (!circle.plane.xaxis.Unitize())
      {
        // Then: just use a vector perp to zaxis
        circle.plane.xaxis.PerpendicularTo(circle.plane.zaxis);
      }
    }
    circle.plane.yaxis = ON_CrossProduct(circle.plane.zaxis, circle.plane.xaxis);
    circle.plane.yaxis.Unitize();
    circle.plane.UpdateEquation();
    ON_Arc arc(circle, m_angle);
    return arc;
  }
  ON_Arc arc;
  arc.plane = ON_Plane::NanPlane;
  arc.radius = ON_DBL_QNAN;
  return arc;
}